

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dir.c
# Opt level: O1

int enum_dsk_prop(char *dir,char *name,char *ver,FINFO **finfo_buf)

{
  char *pcVar1;
  finfo *pfVar2;
  __mode_t _Var3;
  __uid_t __uid;
  byte bVar4;
  int iVar5;
  uint uVar6;
  int *piVar7;
  DIR *__dirp;
  dirent *pdVar8;
  char *pcVar9;
  FINFO *pFVar10;
  FPROP *pFVar11;
  size_t sVar12;
  passwd *ppVar14;
  byte *pbVar15;
  FINFO *pFVar16;
  char fver [16];
  char tver [16];
  stat sbuf;
  char pname [255];
  char pext [255];
  char text [255];
  char tname [255];
  char namebuf [4096];
  int local_1510;
  char local_14e8 [16];
  char local_14d8 [16];
  stat local_14c8;
  byte local_1438 [256];
  char local_1338 [256];
  char local_1238 [256];
  byte local_1138 [256];
  byte local_1038 [4104];
  ulong uVar13;
  
  piVar7 = __errno_location();
  *piVar7 = 0;
  alarm(TIMEOUT_TIME);
  do {
    *piVar7 = 0;
    __dirp = opendir(dir);
    if (__dirp != (DIR *)0x0) {
      alarm(0);
      alarm(TIMEOUT_TIME);
      pdVar8 = readdir(__dirp);
      alarm(0);
      local_1510 = 0;
      pFVar16 = (FINFO *)0x0;
      goto LAB_001170a4;
    }
  } while (*piVar7 == 4);
  alarm(0);
  goto LAB_00117054;
LAB_001170a4:
  if (pdVar8 == (dirent *)0x0) {
    if (*piVar7 != 4) {
      closedir(__dirp);
      if (local_1510 < 1) {
        return local_1510;
      }
      *finfo_buf = pFVar16;
      return local_1510;
    }
  }
  else {
    pcVar1 = pdVar8->d_name;
    iVar5 = strcmp(pcVar1,".");
    if (((iVar5 != 0) && (iVar5 = strcmp(pcVar1,".."), iVar5 != 0)) && (pdVar8->d_ino != 0)) {
      strcpy((char *)local_1138,pcVar1);
      if (local_1138[0] != 0) {
        pbVar15 = local_1138;
        bVar4 = local_1138[0];
        do {
          pbVar15 = pbVar15 + 1;
          if ((byte)(bVar4 + 0xbf) < 0x1a) {
            pbVar15[-1] = bVar4 | 0x20;
          }
          bVar4 = *pbVar15;
        } while (bVar4 != 0);
      }
      strcpy((char *)local_1438,name);
      if (local_1438[0] != 0) {
        pbVar15 = local_1438;
        bVar4 = local_1438[0];
        do {
          pbVar15 = pbVar15 + 1;
          if ((byte)(bVar4 + 0xbf) < 0x1a) {
            pbVar15[-1] = bVar4 | 0x20;
          }
          bVar4 = *pbVar15;
        } while (bVar4 != 0);
      }
      separate_version((char *)local_1138,local_14d8,0);
      pcVar9 = strrchr((char *)local_1138,0x2e);
      if (pcVar9 == (char *)0x0) {
        local_1238[0] = '\0';
      }
      else {
        *pcVar9 = '\0';
        strcpy(local_1238,pcVar9 + 1);
      }
      pcVar9 = strrchr((char *)local_1438,0x2e);
      if (pcVar9 == (char *)0x0) {
        local_1338[0] = '\0';
      }
      else {
        *pcVar9 = '\0';
        strcpy(local_1338,pcVar9 + 1);
      }
      iVar5 = match_pattern((char *)local_1138,(char *)local_1438);
      if (((iVar5 != 0) && (iVar5 = match_pattern(local_1238,local_1338), iVar5 != 0)) &&
         (iVar5 = match_pattern(local_14d8,ver), iVar5 != 0)) {
        if (FreeFinfoList == (FINFO *)0x0) {
          pFVar10 = (FINFO *)calloc(1,0x228);
          if (pFVar10 != (FINFO *)0x0) {
            pFVar11 = (FPROP *)calloc(1,0x118);
            pFVar10->prop = pFVar11;
            if (pFVar11 != (FPROP *)0x0) goto LAB_001172a7;
            free(pFVar10);
          }
          pFVar10 = (FINFO *)0x0;
        }
        else {
          pFVar10 = FreeFinfoList;
          FreeFinfoList = FreeFinfoList->next;
        }
LAB_001172a7:
        pfVar2 = pFVar16;
        if (pFVar10 == (FINFO *)0x0) goto LAB_00117521;
        pFVar10->next = pFVar16;
        sprintf((char *)local_1038,"%s/%s",dir,pcVar1);
        alarm(TIMEOUT_TIME);
        do {
          *piVar7 = 0;
          iVar5 = stat((char *)local_1038,&local_14c8);
          if (iVar5 != -1) {
            alarm(0);
            goto LAB_00117319;
          }
        } while (*piVar7 == 4);
        alarm(0);
        pfVar2 = pFVar10;
        if (*piVar7 != 2) goto LAB_0011754a;
LAB_00117319:
        strcpy((char *)local_1038,pcVar1);
        _Var3 = local_14c8.st_mode;
        if ((local_14c8.st_mode & 0xf000) == 0x4000) {
          pFVar10->dirp = 1;
          quote_dname((char *)local_1038);
          strcpy(pFVar10->lname,(char *)local_1038);
          sVar12 = strlen((char *)local_1038);
          (pFVar10->lname + sVar12)[0] = '>';
          (pFVar10->lname + sVar12)[1] = '\0';
          sVar12 = sVar12 + 1;
        }
        else {
          pFVar10->dirp = 0;
          quote_fname((char *)local_1038);
          sVar12 = strlen((char *)local_1038);
          strcpy(pFVar10->lname,(char *)local_1038);
          pFVar10->lname[sVar12] = '\0';
        }
        pFVar10->lname_len = sVar12;
        strcpy((char *)local_1038,pcVar1);
        separate_version((char *)local_1038,local_14e8,1);
        if (local_1038[0] != 0) {
          pbVar15 = local_1038;
          bVar4 = local_1038[0];
          do {
            pbVar15 = pbVar15 + 1;
            if ((byte)(bVar4 + 0xbf) < 0x1a) {
              pbVar15[-1] = bVar4 | 0x20;
            }
            bVar4 = *pbVar15;
          } while (bVar4 != 0);
        }
        strcpy(pFVar10->no_ver_name,(char *)local_1038);
        if (local_14e8[0] == '\0') {
          uVar6 = 0;
        }
        else {
          uVar13 = strtoul(local_14e8,(char **)0x0,10);
          uVar6 = (uint)uVar13;
        }
        pFVar10->version = uVar6;
        pFVar10->ino = local_14c8.st_ino;
        pFVar10->prop->length = (uint)local_14c8.st_size;
        pFVar10->prop->wdate = (int)local_14c8.st_mtim.tv_sec + 0x1c94b00;
        pFVar10->prop->rdate = (int)local_14c8.st_atim.tv_sec + 0x1c94b00;
        pFVar10->prop->protect = _Var3;
        alarm(TIMEOUT_TIME);
        __uid = local_14c8.st_uid;
        do {
          *piVar7 = 0;
          ppVar14 = getpwuid(__uid);
          if (ppVar14 != (passwd *)0x0) {
            alarm(0);
            pcVar1 = ppVar14->pw_name;
            sVar12 = strlen(pcVar1);
            strcpy(pFVar10->prop->author,pcVar1);
            pFVar10->prop->author[sVar12] = '\0';
            goto LAB_001174de;
          }
        } while (*piVar7 == 4);
        alarm(0);
        sVar12 = 0;
LAB_001174de:
        pFVar10->prop->au_len = sVar12;
        local_1510 = local_1510 + 1;
        pFVar16 = pFVar10;
      }
    }
  }
  *piVar7 = 0;
  alarm(TIMEOUT_TIME);
  pdVar8 = readdir(__dirp);
  alarm(0);
  goto LAB_001170a4;
LAB_00117521:
  do {
    pFVar10 = pfVar2;
    pfVar2 = pFVar10->next;
  } while (pfVar2 != (finfo *)0x0);
  pFVar10->next = FreeFinfoList;
  FreeFinfoList = pFVar16;
  goto LAB_0011756e;
LAB_0011754a:
  do {
    pFVar16 = pfVar2;
    pfVar2 = pFVar16->next;
  } while (pfVar2 != (finfo *)0x0);
  pFVar16->next = FreeFinfoList;
  FreeFinfoList = pFVar10;
LAB_0011756e:
  closedir(__dirp);
LAB_00117054:
  *Lisp_errno = *piVar7;
  return -1;
}

Assistant:

static int enum_dsk_prop(char *dir, char *name, char *ver, FINFO **finfo_buf)
{
  struct dirent *dp;
  FINFO *prevp;
  FINFO *nextp;
  int n, rval;
  size_t len;
  DIR *dirp;
  struct passwd *pwd;
  struct stat sbuf;
  char namebuf[MAXPATHLEN];
  char fver[VERSIONLEN];

  errno = 0;
  TIMEOUT0(dirp = opendir(dir));
  if (dirp == NULL) {
    *Lisp_errno = errno;
    return (-1);
  }

  for (S_TOUT(dp = readdir(dirp)), nextp = prevp = (FINFO *)NULL, n = 0;
       dp != (struct dirent *)NULL || errno == EINTR;
       errno = 0, S_TOUT(dp = readdir(dirp)), prevp = nextp)
    if (dp) {
      if (strcmp(dp->d_name, ".") == 0 || strcmp(dp->d_name, "..") == 0 || dp->d_ino == 0) continue;
      MatchP((char *)dp->d_name, name, ver, match, unmatch);
    unmatch:
      continue;
    match:
      AllocFinfo(nextp);
      if (nextp == (FINFO *)NULL) {
        FreeFinfo(prevp);
        closedir(dirp);
        *Lisp_errno = errno;
        return (-1);
      }
      nextp->next = prevp;
      sprintf(namebuf, "%s/%s", dir, dp->d_name);
      TIMEOUT(rval = stat(namebuf, &sbuf));
      if (rval == -1 && errno != ENOENT) {
        /*
         * ENOENT error might be caused by missing symbolic
         * link. We should ignore such error here.
         */
        FreeFinfo(nextp);
        closedir(dirp);
        *Lisp_errno = errno;
        return (-1);
      }

      strcpy(namebuf, dp->d_name);
      if (S_ISDIR(sbuf.st_mode)) {
        nextp->dirp = 1;
        quote_dname(namebuf);
        strcpy(nextp->lname, namebuf);
        len = strlen(namebuf);
        *(nextp->lname + len) = DIRCHAR;
        *(nextp->lname + len + 1) = '\0';
        nextp->lname_len = len + 1;
      } else {
        /* All other types than directory. */
        nextp->dirp = 0;
        quote_fname(namebuf);
        len = strlen(namebuf);
        strcpy(nextp->lname, namebuf);
        *(nextp->lname + len) = '\0';
        nextp->lname_len = len;
      }

      strcpy(namebuf, dp->d_name);
      len = strlen(namebuf);
      separate_version(namebuf, fver, 1);
      DOWNCASE(namebuf);
      strcpy(nextp->no_ver_name, namebuf);
      if (*fver == '\0')
        nextp->version = 0;
      else
        nextp->version = strtoul(fver, (char **)NULL, 10);
      nextp->ino = sbuf.st_ino;
      nextp->prop->length = (unsigned)sbuf.st_size;
      nextp->prop->wdate = (unsigned)ToLispTime(sbuf.st_mtime);
      nextp->prop->rdate = (unsigned)ToLispTime(sbuf.st_atime);
      nextp->prop->protect = (unsigned)sbuf.st_mode;
      TIMEOUT0(pwd = getpwuid(sbuf.st_uid));
      if (pwd == (struct passwd *)NULL) {
        nextp->prop->au_len = 0;
      } else {
        len = strlen(pwd->pw_name);
        strcpy(nextp->prop->author, pwd->pw_name);
        *(nextp->prop->author + len) = '\0';
        nextp->prop->au_len = len;
      }
      n++;
    }
  closedir(dirp);
  if (n > 0) *finfo_buf = prevp;
  return (n);
}